

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

void embree::sse2::
     BVHNIntersectorKHybrid<4,_4,_1,_true,_embree::sse2::ArrayIntersectorK_1<4,_embree::sse2::QuadMvIntersectorKPluecker<4,_4,_true>_>,_true>
     ::occluded(vint<4> *valid_i,Intersectors *This,RayK<4> *ray,RayQueryContext *context)

{
  NodeRef *pNVar1;
  size_t sVar2;
  Ref<embree::Geometry> *pRVar3;
  Geometry *pGVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  undefined8 uVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [12];
  undefined1 *puVar12;
  long lVar13;
  ulong uVar14;
  RTCRayN *pRVar15;
  RTCFilterFunctionN p_Var16;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *paVar17;
  int iVar18;
  ulong uVar19;
  vint<4> *pvVar20;
  uint uVar21;
  NodeRef *pNVar22;
  long lVar23;
  size_t sVar24;
  size_t sVar25;
  size_t sVar26;
  bool bVar27;
  bool bVar28;
  uint uVar29;
  uint uVar30;
  uint uVar31;
  uint uVar32;
  uint uVar33;
  uint uVar34;
  uint uVar35;
  uint uVar36;
  uint uVar37;
  uint uVar38;
  uint uVar39;
  uint uVar40;
  float fVar41;
  float fVar54;
  float fVar55;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar42;
  undefined1 auVar43 [16];
  float fVar56;
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  float fVar57;
  float fVar65;
  float fVar66;
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  float fVar67;
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  float fVar68;
  float fVar78;
  float fVar79;
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar73;
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  float fVar83;
  float fVar84;
  float fVar89;
  float fVar91;
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  float fVar90;
  float fVar92;
  float fVar93;
  float fVar94;
  float fVar95;
  float fVar96;
  undefined1 auVar88 [16];
  uint uVar97;
  float fVar98;
  uint uVar104;
  uint uVar106;
  uint uVar108;
  undefined1 auVar99 [16];
  float fVar105;
  float fVar107;
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  float fVar109;
  float fVar110;
  float fVar117;
  float fVar119;
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  float fVar121;
  undefined1 auVar113 [16];
  float fVar118;
  float fVar120;
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  float fVar122;
  float fVar129;
  float fVar130;
  undefined1 auVar123 [16];
  float fVar131;
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  float fVar132;
  float fVar133;
  float fVar137;
  float fVar139;
  float fVar140;
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  float fVar138;
  float fVar141;
  undefined1 auVar136 [16];
  float fVar142;
  float fVar143;
  float fVar144;
  float fVar148;
  float fVar151;
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  float fVar149;
  float fVar150;
  float fVar152;
  float fVar153;
  float fVar154;
  float fVar155;
  float fVar156;
  undefined1 auVar147 [16];
  float fVar157;
  float fVar158;
  float fVar159;
  float fVar162;
  float fVar165;
  undefined1 auVar160 [16];
  float fVar163;
  float fVar164;
  float fVar166;
  float fVar167;
  float fVar168;
  float fVar169;
  undefined1 auVar161 [16];
  float fVar170;
  float fVar171;
  float fVar173;
  float fVar174;
  float fVar175;
  float fVar176;
  undefined1 auVar172 [16];
  float fVar177;
  float fVar178;
  float fVar179;
  float fVar180;
  float fVar184;
  float fVar186;
  undefined1 auVar181 [16];
  float fVar185;
  float fVar187;
  float fVar188;
  float fVar189;
  float fVar190;
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar191 [16];
  float fVar192;
  float fVar193;
  float fVar194;
  float fVar195;
  float fVar196;
  float fVar197;
  float fVar200;
  float fVar201;
  float fVar202;
  float fVar203;
  float fVar204;
  float fVar205;
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  uint local_1a48;
  uint uStack_1a44;
  uint uStack_1a40;
  uint uStack_1a3c;
  float local_19c8;
  float fStack_19c4;
  float fStack_19c0;
  undefined1 local_19b8 [16];
  float local_19a8;
  float fStack_19a4;
  float fStack_19a0;
  float fStack_199c;
  undefined1 local_1938 [16];
  undefined1 local_1928 [16];
  undefined1 local_1918 [8];
  float fStack_1910;
  float fStack_190c;
  undefined1 local_1908 [8];
  float fStack_1900;
  float fStack_18fc;
  undefined1 local_18f8 [8];
  float fStack_18f0;
  float fStack_18ec;
  RTCFilterFunctionNArguments args;
  undefined8 local_1868;
  undefined8 uStack_1860;
  undefined1 local_1858 [8];
  float fStack_1850;
  float fStack_184c;
  float local_1848;
  float fStack_1844;
  float fStack_1840;
  float fStack_183c;
  float local_1838;
  float fStack_1834;
  float fStack_1830;
  float fStack_182c;
  undefined1 local_1828 [16];
  uint local_1818;
  uint uStack_1814;
  uint uStack_1810;
  uint uStack_180c;
  undefined4 local_1808;
  undefined4 uStack_1804;
  undefined4 uStack_1800;
  undefined4 uStack_17fc;
  uint local_17f8;
  uint uStack_17f4;
  uint uStack_17f0;
  uint uStack_17ec;
  uint local_17e8;
  uint uStack_17e4;
  uint uStack_17e0;
  uint uStack_17dc;
  uint local_17d8;
  uint uStack_17d4;
  uint uStack_17d0;
  uint uStack_17cc;
  undefined1 local_17c8 [16];
  undefined1 local_17b8 [16];
  undefined1 local_17a8 [16];
  undefined1 local_1798 [16];
  float local_1788;
  float fStack_1784;
  float fStack_1780;
  float fStack_177c;
  float local_1778;
  float fStack_1774;
  float fStack_1770;
  float fStack_176c;
  float local_1768;
  float fStack_1764;
  float fStack_1760;
  float fStack_175c;
  float local_1758;
  float fStack_1754;
  float fStack_1750;
  float fStack_174c;
  float local_1748;
  float fStack_1744;
  float fStack_1740;
  float fStack_173c;
  float local_1738;
  float fStack_1734;
  float fStack_1730;
  float fStack_172c;
  float local_1728;
  float fStack_1724;
  float fStack_1720;
  float fStack_171c;
  float local_1718;
  float fStack_1714;
  float fStack_1710;
  float fStack_170c;
  float local_1708;
  float fStack_1704;
  float fStack_1700;
  float fStack_16fc;
  float local_16f8;
  float fStack_16f4;
  float fStack_16f0;
  float fStack_16ec;
  undefined1 local_16e8 [8];
  float fStack_16e0;
  float fStack_16dc;
  NodeRef stack_node [241];
  vfloat<4> stack_near [241];
  
  stack_node[1].ptr = *(size_t *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (stack_node[1].ptr != 8) {
    if ((context->user != (RTCRayQueryContext *)0x0) &&
       ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) != RTC_RAY_QUERY_FLAG_INCOHERENT)) {
      occludedCoherent(valid_i,This,ray,context);
      return;
    }
    auVar146 = *(undefined1 (*) [16])(ray + 0x80);
    auVar111._0_4_ = -(uint)((valid_i->field_0).i[0] == -1 && 0.0 <= auVar146._0_4_);
    auVar111._4_4_ = -(uint)((valid_i->field_0).i[1] == -1 && 0.0 <= auVar146._4_4_);
    auVar111._8_4_ = -(uint)((valid_i->field_0).i[2] == -1 && 0.0 <= auVar146._8_4_);
    auVar111._12_4_ = -(uint)((valid_i->field_0).i[3] == -1 && 0.0 <= auVar146._12_4_);
    iVar18 = movmskps((int)This,auVar111);
    if (iVar18 != 0) {
      auVar85 = *(undefined1 (*) [16])(ray + 0x40);
      auVar160 = divps(_DAT_01feca10,auVar85);
      fVar132 = (float)DAT_01ff1d40;
      fVar137 = DAT_01ff1d40._4_4_;
      fVar139 = DAT_01ff1d40._8_4_;
      fVar140 = DAT_01ff1d40._12_4_;
      uVar29 = -(uint)(fVar132 <= ABS(auVar85._0_4_));
      uVar32 = -(uint)(fVar137 <= ABS(auVar85._4_4_));
      uVar35 = -(uint)(fVar139 <= ABS(auVar85._8_4_));
      uVar38 = -(uint)(fVar140 <= ABS(auVar85._12_4_));
      auVar85 = *(undefined1 (*) [16])(ray + 0x50);
      auVar172 = divps(_DAT_01feca10,auVar85);
      uVar30 = -(uint)(fVar132 <= ABS(auVar85._0_4_));
      uVar33 = -(uint)(fVar137 <= ABS(auVar85._4_4_));
      uVar36 = -(uint)(fVar139 <= ABS(auVar85._8_4_));
      uVar39 = -(uint)(fVar140 <= ABS(auVar85._12_4_));
      auVar85 = *(undefined1 (*) [16])(ray + 0x60);
      auVar181 = divps(_DAT_01feca10,auVar85);
      uVar31 = -(uint)(fVar132 <= ABS(auVar85._0_4_));
      uVar34 = -(uint)(fVar137 <= ABS(auVar85._4_4_));
      uVar37 = -(uint)(fVar139 <= ABS(auVar85._8_4_));
      uVar40 = -(uint)(fVar140 <= ABS(auVar85._12_4_));
      uVar97 = (uint)DAT_0201c930;
      uVar104 = DAT_0201c930._4_4_;
      uVar106 = DAT_0201c930._8_4_;
      uVar108 = DAT_0201c930._12_4_;
      auVar85 = maxps(*(undefined1 (*) [16])(ray + 0x30),(undefined1  [16])0x0);
      auVar145 = maxps(auVar146,(undefined1  [16])0x0);
      auVar86._0_4_ = auVar85._0_4_ & auVar111._0_4_;
      auVar86._4_4_ = auVar85._4_4_ & auVar111._4_4_;
      auVar86._8_4_ = auVar85._8_4_ & auVar111._8_4_;
      auVar86._12_4_ = auVar85._12_4_ & auVar111._12_4_;
      auVar191._0_8_ = CONCAT44(~auVar111._4_4_,~auVar111._0_4_) & 0x7f8000007f800000;
      auVar191._8_4_ = ~auVar111._8_4_ & 0x7f800000;
      auVar191._12_4_ = ~auVar111._12_4_ & 0x7f800000;
      auVar146._0_4_ = auVar145._0_4_ & auVar111._0_4_;
      auVar146._4_4_ = auVar145._4_4_ & auVar111._4_4_;
      auVar146._8_4_ = auVar145._8_4_ & auVar111._8_4_;
      auVar146._12_4_ = auVar145._12_4_ & auVar111._12_4_;
      auVar85._0_8_ = CONCAT44(~auVar111._4_4_,~auVar111._0_4_) & 0xff800000ff800000;
      auVar85._8_4_ = ~auVar111._8_4_ & 0xff800000;
      auVar85._12_4_ = ~auVar111._12_4_ & 0xff800000;
      if (context->user == (RTCRayQueryContext *)0x0) {
        uVar21 = 3;
      }
      else {
        uVar21 = ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) ==
                 RTC_RAY_QUERY_FLAG_INCOHERENT) + 2;
      }
      fVar132 = *(float *)ray;
      fVar137 = *(float *)(ray + 4);
      fVar139 = *(float *)(ray + 8);
      fVar140 = *(float *)(ray + 0xc);
      fVar5 = *(float *)(ray + 0x10);
      fVar6 = *(float *)(ray + 0x14);
      fVar7 = *(float *)(ray + 0x18);
      fVar8 = *(float *)(ray + 0x1c);
      _local_16e8 = *(undefined1 (*) [16])(ray + 0x20);
      fVar157 = (float)(auVar160._0_4_ & uVar29 | ~uVar29 & uVar97);
      fVar162 = (float)(auVar160._4_4_ & uVar32 | ~uVar32 & uVar104);
      fVar165 = (float)(auVar160._8_4_ & uVar35 | ~uVar35 & uVar106);
      fVar168 = (float)(auVar160._12_4_ & uVar38 | ~uVar38 & uVar108);
      fVar170 = (float)(auVar172._0_4_ & uVar30 | ~uVar30 & uVar97);
      fVar173 = (float)(auVar172._4_4_ & uVar33 | ~uVar33 & uVar104);
      fVar175 = (float)(auVar172._8_4_ & uVar36 | ~uVar36 & uVar106);
      fVar177 = (float)(auVar172._12_4_ & uVar39 | ~uVar39 & uVar108);
      fVar179 = (float)(auVar181._0_4_ & uVar31 | ~uVar31 & uVar97);
      fVar184 = (float)(auVar181._4_4_ & uVar34 | ~uVar34 & uVar104);
      fVar186 = (float)(auVar181._8_4_ & uVar37 | ~uVar37 & uVar106);
      fVar188 = (float)(auVar181._12_4_ & uVar40 | ~uVar40 & uVar108);
      uVar19 = CONCAT44(auVar111._4_4_,auVar111._0_4_);
      local_19b8._0_8_ = uVar19 ^ 0xffffffffffffffff;
      local_19b8._8_4_ = auVar111._8_4_ ^ 0xffffffff;
      local_19b8._12_4_ = auVar111._12_4_ ^ 0xffffffff;
      auVar146 = auVar146 | auVar85;
      pNVar22 = stack_node + 2;
      stack_node[0].ptr = 0xfffffffffffffff8;
      paVar17 = &stack_near[2].field_0;
      stack_near[0].field_0._0_8_ = 0x7f8000007f800000;
      stack_near[0].field_0._8_8_ = 0x7f8000007f800000;
      stack_near[1].field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)(auVar191 | auVar86);
      puVar12 = mm_lookupmask_ps;
      auVar145._8_4_ = 0xffffffff;
      auVar145._0_8_ = 0xffffffffffffffff;
      auVar145._12_4_ = 0xffffffff;
      local_1798 = mm_lookupmask_ps._0_16_;
      local_17a8 = mm_lookupmask_ps._0_16_ ^ auVar145;
      local_17b8 = mm_lookupmask_ps._240_16_;
      local_17c8 = mm_lookupmask_ps._240_16_ ^ auVar145;
LAB_001bd393:
      paVar17 = paVar17 + -1;
      pNVar1 = pNVar22 + -1;
      pNVar22 = pNVar22 + -1;
      bVar28 = true;
      if (pNVar1->ptr != 0xfffffffffffffff8) {
        aVar73.v = *(__m128 *)paVar17->v;
        fVar142 = auVar146._0_4_;
        fVar148 = auVar146._4_4_;
        fVar151 = auVar146._8_4_;
        fVar154 = auVar146._12_4_;
        auVar160._4_4_ = -(uint)(aVar73.v[1] < fVar148);
        auVar160._0_4_ = -(uint)(aVar73.v[0] < fVar142);
        auVar160._8_4_ = -(uint)(aVar73.v[2] < fVar151);
        auVar160._12_4_ = -(uint)(aVar73.v[3] < fVar154);
        uVar29 = movmskps((int)puVar12,auVar160);
        puVar12 = (undefined1 *)(ulong)uVar29;
        sVar24 = pNVar1->ptr;
        if (uVar29 != 0) {
          do {
            if ((sVar24 & 8) != 0) {
              if (sVar24 == 0xfffffffffffffff8) goto LAB_001be938;
              auVar172._4_4_ = -(uint)(aVar73.v[1] < fVar148);
              auVar172._0_4_ = -(uint)(aVar73.v[0] < fVar142);
              auVar172._8_4_ = -(uint)(aVar73.v[2] < fVar151);
              auVar172._12_4_ = -(uint)(aVar73.v[3] < fVar154);
              uVar29 = movmskps((int)puVar12,auVar172);
              puVar12 = (undefined1 *)(ulong)uVar29;
              if (uVar29 != 0) {
                valid_i = (vint<4> *)((ulong)((uint)sVar24 & 0xf) - 8);
                auVar181 = local_19b8;
                if (valid_i == (vint<4> *)0x0) goto LAB_001be900;
                auVar43._0_8_ = local_19b8._0_8_ ^ 0xffffffffffffffff;
                auVar43._8_4_ = local_19b8._8_4_ ^ 0xffffffff;
                auVar43._12_4_ = local_19b8._12_4_ ^ 0xffffffff;
                lVar23 = (sVar24 & 0xfffffffffffffff0) + 0xc0;
                pvVar20 = (vint<4> *)0x0;
                goto LAB_001bd5c9;
              }
              break;
            }
            uVar19 = 0;
            sVar25 = 8;
            aVar42 = _DAT_01feb9f0;
            do {
              sVar2 = *(size_t *)((sVar24 & 0xfffffffffffffff0) + uVar19 * 8);
              sVar26 = sVar25;
              aVar73 = aVar42;
              if (sVar2 != 8) {
                fVar109 = *(float *)(sVar24 + 0x20 + uVar19 * 4);
                fVar117 = *(float *)(sVar24 + 0x30 + uVar19 * 4);
                fVar119 = *(float *)(sVar24 + 0x40 + uVar19 * 4);
                fVar121 = *(float *)(sVar24 + 0x50 + uVar19 * 4);
                auVar58._0_8_ =
                     CONCAT44((fVar109 - fVar137) * fVar162,(fVar109 - fVar132) * fVar157);
                auVar58._8_4_ = (fVar109 - fVar139) * fVar165;
                auVar58._12_4_ = (fVar109 - fVar140) * fVar168;
                auVar69._0_8_ = CONCAT44((fVar119 - fVar6) * fVar173,(fVar119 - fVar5) * fVar170);
                auVar69._8_4_ = (fVar119 - fVar7) * fVar175;
                auVar69._12_4_ = (fVar119 - fVar8) * fVar177;
                fVar109 = *(float *)(sVar24 + 0x60 + uVar19 * 4);
                auVar99._0_8_ =
                     CONCAT44((fVar109 - (float)local_16e8._4_4_) * fVar184,
                              (fVar109 - (float)local_16e8._0_4_) * fVar179);
                auVar99._8_4_ = (fVar109 - fStack_16e0) * fVar186;
                auVar99._12_4_ = (fVar109 - fStack_16dc) * fVar188;
                auVar80._0_4_ = (fVar117 - fVar132) * fVar157;
                auVar80._4_4_ = (fVar117 - fVar137) * fVar162;
                auVar80._8_4_ = (fVar117 - fVar139) * fVar165;
                auVar80._12_4_ = (fVar117 - fVar140) * fVar168;
                auVar87._0_4_ = (fVar121 - fVar5) * fVar170;
                auVar87._4_4_ = (fVar121 - fVar6) * fVar173;
                auVar87._8_4_ = (fVar121 - fVar7) * fVar175;
                auVar87._12_4_ = (fVar121 - fVar8) * fVar177;
                fVar109 = *(float *)(sVar24 + 0x70 + uVar19 * 4);
                auVar123._0_4_ = (fVar109 - (float)local_16e8._0_4_) * fVar179;
                auVar123._4_4_ = (fVar109 - (float)local_16e8._4_4_) * fVar184;
                auVar123._8_4_ = (fVar109 - fStack_16e0) * fVar186;
                auVar123._12_4_ = (fVar109 - fStack_16dc) * fVar188;
                auVar112._8_4_ = auVar58._8_4_;
                auVar112._0_8_ = auVar58._0_8_;
                auVar112._12_4_ = auVar58._12_4_;
                auVar85 = minps(auVar112,auVar80);
                auVar134._8_4_ = auVar69._8_4_;
                auVar134._0_8_ = auVar69._0_8_;
                auVar134._12_4_ = auVar69._12_4_;
                auVar145 = minps(auVar134,auVar87);
                auVar85 = maxps(auVar85,auVar145);
                auVar135._8_4_ = auVar99._8_4_;
                auVar135._0_8_ = auVar99._0_8_;
                auVar135._12_4_ = auVar99._12_4_;
                auVar145 = minps(auVar135,auVar123);
                auVar160 = maxps(auVar85,auVar145);
                auVar85 = maxps(auVar58,auVar80);
                auVar145 = maxps(auVar69,auVar87);
                auVar85 = minps(auVar85,auVar145);
                auVar145 = maxps(auVar99,auVar123);
                fVar109 = auVar160._0_4_ * 0.99999964;
                fVar117 = auVar160._4_4_ * 0.99999964;
                auVar70._4_4_ = fVar117;
                auVar70._0_4_ = fVar109;
                fVar119 = auVar160._8_4_ * 0.99999964;
                fVar121 = auVar160._12_4_ * 0.99999964;
                auVar85 = minps(auVar85,auVar145);
                auVar59._0_4_ = auVar85._0_4_ * 1.0000004;
                auVar59._4_4_ = auVar85._4_4_ * 1.0000004;
                auVar59._8_4_ = auVar85._8_4_ * 1.0000004;
                auVar59._12_4_ = auVar85._12_4_ * 1.0000004;
                auVar70._8_4_ = fVar119;
                auVar70._12_4_ = fVar121;
                auVar145 = maxps(auVar70,auVar191 | auVar86);
                auVar85 = minps(auVar59,auVar146);
                uVar30 = -(uint)(auVar145._0_4_ <= auVar85._0_4_);
                uVar31 = -(uint)(auVar145._4_4_ <= auVar85._4_4_);
                uVar32 = -(uint)(auVar145._8_4_ <= auVar85._8_4_);
                uVar33 = -(uint)(auVar145._12_4_ <= auVar85._12_4_);
                auVar71._4_4_ = uVar31;
                auVar71._0_4_ = uVar30;
                auVar71._8_4_ = uVar32;
                auVar71._12_4_ = uVar33;
                uVar29 = movmskps((int)valid_i,auVar71);
                valid_i = (vint<4> *)(ulong)uVar29;
                if ((uVar29 != 0) &&
                   (auVar113._0_4_ = (uint)fVar109 & uVar30, auVar113._4_4_ = (uint)fVar117 & uVar31
                   , auVar113._8_4_ = (uint)fVar119 & uVar32,
                   auVar113._12_4_ = (uint)fVar121 & uVar33,
                   auVar72._0_8_ = CONCAT44(~uVar31,~uVar30) & 0x7f8000007f800000,
                   auVar72._8_4_ = ~uVar32 & 0x7f800000, auVar72._12_4_ = ~uVar33 & 0x7f800000,
                   aVar73 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)(auVar72 | auVar113),
                   sVar26 = sVar2, sVar25 != 8)) {
                  pNVar22->ptr = sVar25;
                  pNVar22 = pNVar22 + 1;
                  *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)paVar17->v = aVar42;
                  paVar17 = paVar17 + 1;
                }
              }
            } while ((sVar2 != 8) &&
                    (bVar27 = uVar19 < 3, uVar19 = uVar19 + 1, sVar25 = sVar26, aVar42 = aVar73,
                    bVar27));
            if (sVar26 == 8) {
LAB_001bd54b:
              puVar12 = (undefined1 *)0x0;
            }
            else {
              auVar60._4_4_ = -(uint)(aVar73.v[1] < fVar148);
              auVar60._0_4_ = -(uint)(aVar73.v[0] < fVar142);
              auVar60._8_4_ = -(uint)(aVar73.v[2] < fVar151);
              auVar60._12_4_ = -(uint)(aVar73.v[3] < fVar154);
              uVar29 = movmskps((uint)sVar24,auVar60);
              puVar12 = (undefined1 *)CONCAT71((uint7)(uint3)(uVar29 >> 8),1);
              if ((uVar29 >> 3 & 0x1f) +
                  (uVar29 >> 1 & 1) + (uVar29 & 1) + (uint)((uVar29 >> 2 & 1) != 0) <= uVar21) {
                pNVar22->ptr = sVar26;
                pNVar22 = pNVar22 + 1;
                *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)paVar17->v = aVar73;
                paVar17 = paVar17 + 1;
                goto LAB_001bd54b;
              }
            }
            sVar24 = sVar26;
          } while ((char)puVar12 != '\0');
        }
        bVar28 = false;
      }
      goto LAB_001be938;
    }
  }
  return;
  while( true ) {
    pvVar20 = (vint<4> *)((long)&pvVar20->field_0 + 1);
    lVar23 = lVar23 + 0xe0;
    if (valid_i <= pvVar20) break;
LAB_001bd5c9:
    lVar13 = (long)pvVar20 * 0xe0 + (sVar24 & 0xfffffffffffffff0);
    uVar19 = 0;
    auVar85 = auVar43;
    local_1928 = auVar43;
    while( true ) {
      local_17f8 = *(uint *)(lVar23 + uVar19 * 4);
      uVar14 = (ulong)local_17f8;
      if (uVar14 == 0xffffffff) break;
      fVar109 = *(float *)(lVar23 + -0xc0 + uVar19 * 4);
      fVar117 = *(float *)(lVar23 + -0xb0 + uVar19 * 4);
      fVar119 = *(float *)(lVar23 + -0xa0 + uVar19 * 4);
      local_1728 = *(float *)(lVar23 + -0x90 + uVar19 * 4);
      local_1748 = *(float *)(lVar23 + -0x80 + uVar19 * 4);
      local_1738 = *(float *)(lVar23 + -0x70 + uVar19 * 4);
      fVar121 = *(float *)(lVar23 + -0x60 + uVar19 * 4);
      fVar141 = *(float *)(lVar23 + -0x50 + uVar19 * 4);
      fVar190 = *(float *)(lVar23 + -0x40 + uVar19 * 4);
      local_1768 = *(float *)(lVar23 + -0x30 + uVar19 * 4);
      local_1758 = *(float *)(lVar23 + -0x20 + uVar19 * 4);
      local_1908._4_4_ = *(float *)(lVar23 + -0x10 + uVar19 * 4);
      local_1868 = *(undefined8 *)(lVar13 + 0xd0);
      uStack_1860 = *(undefined8 *)(lVar13 + 0xd8);
      fVar41 = *(float *)ray;
      fVar54 = *(float *)(ray + 4);
      fVar55 = *(float *)(ray + 8);
      fVar56 = *(float *)(ray + 0xc);
      fVar180 = *(float *)(ray + 0x10);
      fVar185 = *(float *)(ray + 0x14);
      fVar187 = *(float *)(ray + 0x18);
      fVar189 = *(float *)(ray + 0x1c);
      fVar98 = fVar109 - fVar41;
      fVar105 = fVar109 - fVar54;
      fVar107 = fVar109 - fVar55;
      fVar109 = fVar109 - fVar56;
      fVar110 = fVar117 - fVar180;
      fVar118 = fVar117 - fVar185;
      fVar120 = fVar117 - fVar187;
      fVar117 = fVar117 - fVar189;
      fStack_1724 = local_1728;
      fStack_1720 = local_1728;
      fStack_171c = local_1728;
      fVar196 = local_1728 - fVar41;
      fVar200 = local_1728 - fVar54;
      fVar202 = local_1728 - fVar55;
      fVar204 = local_1728 - fVar56;
      fStack_1764 = local_1768;
      fStack_1760 = local_1768;
      fStack_175c = local_1768;
      fVar41 = local_1768 - fVar41;
      fVar54 = local_1768 - fVar54;
      fVar55 = local_1768 - fVar55;
      fVar56 = local_1768 - fVar56;
      fStack_1744 = local_1748;
      fStack_1740 = local_1748;
      fStack_173c = local_1748;
      fVar143 = local_1748 - fVar180;
      fVar149 = local_1748 - fVar185;
      fVar152 = local_1748 - fVar187;
      fVar155 = local_1748 - fVar189;
      fStack_1754 = local_1758;
      fStack_1750 = local_1758;
      fStack_174c = local_1758;
      fVar180 = local_1758 - fVar180;
      fVar185 = local_1758 - fVar185;
      fVar187 = local_1758 - fVar187;
      fVar189 = local_1758 - fVar189;
      fVar192 = *(float *)(ray + 0x20);
      fVar193 = *(float *)(ray + 0x24);
      fVar194 = *(float *)(ray + 0x28);
      fVar195 = *(float *)(ray + 0x2c);
      fVar158 = fVar119 - fVar192;
      fVar163 = fVar119 - fVar193;
      fVar166 = fVar119 - fVar194;
      fVar119 = fVar119 - fVar195;
      fStack_1734 = local_1738;
      fStack_1730 = local_1738;
      fStack_172c = local_1738;
      fVar197 = local_1738 - fVar192;
      fVar201 = local_1738 - fVar193;
      fVar203 = local_1738 - fVar194;
      fVar205 = local_1738 - fVar195;
      local_1908._0_4_ = local_1908._4_4_;
      fStack_1900 = (float)local_1908._4_4_;
      fStack_18fc = (float)local_1908._4_4_;
      fVar192 = (float)local_1908._4_4_ - fVar192;
      fVar193 = (float)local_1908._4_4_ - fVar193;
      fVar194 = (float)local_1908._4_4_ - fVar194;
      fVar195 = (float)local_1908._4_4_ - fVar195;
      fVar83 = fVar41 - fVar98;
      fVar89 = fVar54 - fVar105;
      fVar91 = fVar55 - fVar107;
      fVar94 = fVar56 - fVar109;
      local_1708 = fVar180 - fVar110;
      fStack_1704 = fVar185 - fVar118;
      fStack_1700 = fVar187 - fVar120;
      fStack_16fc = fVar189 - fVar117;
      local_16f8 = fVar192 - fVar158;
      fStack_16f4 = fVar193 - fVar163;
      fStack_16f0 = fVar194 - fVar166;
      fStack_16ec = fVar195 - fVar119;
      auVar11 = *(undefined1 (*) [12])(ray + 0x60);
      fVar93 = *(float *)(ray + 0x6c);
      fVar96 = *(float *)(ray + 0x50);
      fVar57 = *(float *)(ray + 0x54);
      fVar65 = *(float *)(ray + 0x58);
      fVar66 = *(float *)(ray + 0x5c);
      fVar67 = *(float *)(ray + 0x40);
      fVar68 = *(float *)(ray + 0x44);
      fVar78 = *(float *)(ray + 0x48);
      fVar79 = *(float *)(ray + 0x4c);
      fVar133 = (local_1708 * (fVar192 + fVar158) - (fVar180 + fVar110) * local_16f8) * fVar67 +
                ((fVar41 + fVar98) * local_16f8 - (fVar192 + fVar158) * fVar83) * fVar96 +
                (fVar83 * (fVar180 + fVar110) - (fVar41 + fVar98) * local_1708) *
                *(float *)(ray + 0x60);
      fVar138 = (fStack_1704 * (fVar193 + fVar163) - (fVar185 + fVar118) * fStack_16f4) * fVar68 +
                ((fVar54 + fVar105) * fStack_16f4 - (fVar193 + fVar163) * fVar89) * fVar57 +
                (fVar89 * (fVar185 + fVar118) - (fVar54 + fVar105) * fStack_1704) *
                *(float *)(ray + 100);
      local_1918 = CONCAT44(fVar138,fVar133);
      fStack_1910 = (fStack_1700 * (fVar194 + fVar166) - (fVar187 + fVar120) * fStack_16f0) * fVar78
                    + ((fVar55 + fVar107) * fStack_16f0 - (fVar194 + fVar166) * fVar91) * fVar65 +
                      (fVar91 * (fVar187 + fVar120) - (fVar55 + fVar107) * fStack_1700) *
                      *(float *)(ray + 0x68);
      fStack_190c = (fStack_16fc * (fVar195 + fVar119) - (fVar189 + fVar117) * fStack_16ec) * fVar79
                    + ((fVar56 + fVar109) * fStack_16ec - (fVar195 + fVar119) * fVar94) * fVar66 +
                      (fVar94 * (fVar189 + fVar117) - (fVar56 + fVar109) * fStack_16fc) * fVar93;
      local_1718 = fVar98 - fVar196;
      fStack_1714 = fVar105 - fVar200;
      fStack_1710 = fVar107 - fVar202;
      fStack_170c = fVar109 - fVar204;
      fVar122 = fVar110 - fVar143;
      fVar129 = fVar118 - fVar149;
      fVar130 = fVar120 - fVar152;
      fVar131 = fVar117 - fVar155;
      fVar144 = fVar158 - fVar197;
      fVar150 = fVar163 - fVar201;
      fVar153 = fVar166 - fVar203;
      fVar156 = fVar119 - fVar205;
      local_19c8 = auVar11._0_4_;
      fStack_19c4 = auVar11._4_4_;
      fStack_19c0 = auVar11._8_4_;
      local_18f8._0_4_ =
           (fVar122 * (fVar158 + fVar197) - (fVar110 + fVar143) * fVar144) * fVar67 +
           ((fVar98 + fVar196) * fVar144 - (fVar158 + fVar197) * local_1718) * fVar96 +
           (local_1718 * (fVar110 + fVar143) - (fVar98 + fVar196) * fVar122) * local_19c8;
      local_18f8._4_4_ =
           (fVar129 * (fVar163 + fVar201) - (fVar118 + fVar149) * fVar150) * fVar68 +
           ((fVar105 + fVar200) * fVar150 - (fVar163 + fVar201) * fStack_1714) * fVar57 +
           (fStack_1714 * (fVar118 + fVar149) - (fVar105 + fVar200) * fVar129) * fStack_19c4;
      fStack_18f0 = (fVar130 * (fVar166 + fVar203) - (fVar120 + fVar152) * fVar153) * fVar78 +
                    ((fVar107 + fVar202) * fVar153 - (fVar166 + fVar203) * fStack_1710) * fVar65 +
                    (fStack_1710 * (fVar120 + fVar152) - (fVar107 + fVar202) * fVar130) *
                    fStack_19c0;
      fStack_18ec = (fVar131 * (fVar119 + fVar205) - (fVar117 + fVar155) * fVar156) * fVar79 +
                    ((fVar109 + fVar204) * fVar156 - (fVar119 + fVar205) * fStack_170c) * fVar66 +
                    (fStack_170c * (fVar117 + fVar155) - (fVar109 + fVar204) * fVar131) * fVar93;
      fVar159 = fVar196 - fVar41;
      fVar164 = fVar200 - fVar54;
      fVar167 = fVar202 - fVar55;
      fVar169 = fVar204 - fVar56;
      fVar84 = fVar143 - fVar180;
      fVar90 = fVar149 - fVar185;
      fVar92 = fVar152 - fVar187;
      fVar95 = fVar155 - fVar189;
      fVar171 = fVar197 - fVar192;
      fVar174 = fVar201 - fVar193;
      fVar176 = fVar203 - fVar194;
      fVar178 = fVar205 - fVar195;
      auVar61._0_4_ =
           (fVar84 * (fVar192 + fVar197) - (fVar180 + fVar143) * fVar171) * fVar67 +
           ((fVar41 + fVar196) * fVar171 - (fVar192 + fVar197) * fVar159) * fVar96 +
           (fVar159 * (fVar180 + fVar143) - (fVar41 + fVar196) * fVar84) * local_19c8;
      auVar61._4_4_ =
           (fVar90 * (fVar193 + fVar201) - (fVar185 + fVar149) * fVar174) * fVar68 +
           ((fVar54 + fVar200) * fVar174 - (fVar193 + fVar201) * fVar164) * fVar57 +
           (fVar164 * (fVar185 + fVar149) - (fVar54 + fVar200) * fVar90) * fStack_19c4;
      auVar61._8_4_ =
           (fVar92 * (fVar194 + fVar203) - (fVar187 + fVar152) * fVar176) * fVar78 +
           ((fVar55 + fVar202) * fVar176 - (fVar194 + fVar203) * fVar167) * fVar65 +
           (fVar167 * (fVar187 + fVar152) - (fVar55 + fVar202) * fVar92) * fStack_19c0;
      auVar61._12_4_ =
           (fVar95 * (fVar195 + fVar205) - (fVar189 + fVar155) * fVar178) * fVar79 +
           ((fVar56 + fVar204) * fVar178 - (fVar195 + fVar205) * fVar169) * fVar66 +
           (fVar169 * (fVar189 + fVar155) - (fVar56 + fVar204) * fVar95) * fVar93;
      fVar180 = fVar133 + (float)local_18f8._0_4_ + auVar61._0_4_;
      fVar185 = fVar138 + (float)local_18f8._4_4_ + auVar61._4_4_;
      fVar187 = fStack_1910 + fStack_18f0 + auVar61._8_4_;
      fVar189 = fStack_190c + fStack_18ec + auVar61._12_4_;
      auVar114._8_4_ = fStack_1910;
      auVar114._0_8_ = local_1918;
      auVar114._12_4_ = fStack_190c;
      auVar145 = minps(auVar114,_local_18f8);
      auVar160 = minps(auVar145,auVar61);
      auVar44._8_4_ = fStack_1910;
      auVar44._0_8_ = local_1918;
      auVar44._12_4_ = fStack_190c;
      auVar145 = maxps(auVar44,_local_18f8);
      auVar145 = maxps(auVar145,auVar61);
      fVar41 = ABS(fVar180);
      fVar54 = ABS(fVar185);
      fVar55 = ABS(fVar187);
      fVar56 = ABS(fVar189);
      auVar45._4_4_ = -(uint)(auVar145._4_4_ <= fVar54 * 1.1920929e-07);
      auVar45._0_4_ = -(uint)(auVar145._0_4_ <= fVar41 * 1.1920929e-07);
      auVar45._8_4_ = -(uint)(auVar145._8_4_ <= fVar55 * 1.1920929e-07);
      auVar45._12_4_ = -(uint)(auVar145._12_4_ <= fVar56 * 1.1920929e-07);
      auVar115._4_4_ = -(uint)(-(fVar54 * 1.1920929e-07) <= auVar160._4_4_);
      auVar115._0_4_ = -(uint)(-(fVar41 * 1.1920929e-07) <= auVar160._0_4_);
      auVar115._8_4_ = -(uint)(-(fVar55 * 1.1920929e-07) <= auVar160._8_4_);
      auVar115._12_4_ = -(uint)(-(fVar56 * 1.1920929e-07) <= auVar160._12_4_);
      auVar45 = auVar45 | auVar115;
      auVar46._0_4_ = auVar45._0_4_ & auVar85._0_4_;
      auVar46._4_4_ = auVar45._4_4_ & auVar85._4_4_;
      auVar46._8_4_ = auVar45._8_4_ & auVar85._8_4_;
      auVar46._12_4_ = auVar45._12_4_ & auVar85._12_4_;
      iVar18 = movmskps((int)lVar13,auVar46);
      args.ray = (RTCRayN *)ray;
      if (iVar18 != 0) {
        local_1788 = fVar41;
        fStack_1784 = fVar54;
        fStack_1780 = fVar55;
        fStack_177c = fVar56;
        local_1778 = fVar180;
        fStack_1774 = fVar185;
        fStack_1770 = fVar187;
        fStack_176c = fVar189;
        uVar29 = -(uint)(ABS(fVar84 * fVar144) <= ABS(fVar122 * local_16f8));
        uVar32 = -(uint)(ABS(fVar90 * fVar150) <= ABS(fVar129 * fStack_16f4));
        uVar35 = -(uint)(ABS(fVar92 * fVar153) <= ABS(fVar130 * fStack_16f0));
        uVar38 = -(uint)(ABS(fVar95 * fVar156) <= ABS(fVar131 * fStack_16ec));
        uVar30 = -(uint)(ABS(local_1718 * fVar171) <= ABS(fVar83 * fVar144));
        uVar33 = -(uint)(ABS(fStack_1714 * fVar174) <= ABS(fVar89 * fVar150));
        uVar36 = -(uint)(ABS(fStack_1710 * fVar176) <= ABS(fVar91 * fVar153));
        uVar39 = -(uint)(ABS(fStack_170c * fVar178) <= ABS(fVar94 * fVar156));
        uVar31 = -(uint)(ABS(fVar159 * fVar122) <= ABS(local_1718 * local_1708));
        uVar34 = -(uint)(ABS(fVar164 * fVar129) <= ABS(fStack_1714 * fStack_1704));
        uVar37 = -(uint)(ABS(fVar167 * fVar130) <= ABS(fStack_1710 * fStack_1700));
        uVar40 = -(uint)(ABS(fVar169 * fVar131) <= ABS(fStack_170c * fStack_16fc));
        auVar124._0_4_ = (uint)(fVar122 * fVar171 - fVar84 * fVar144) & uVar29;
        auVar124._4_4_ = (uint)(fVar129 * fVar174 - fVar90 * fVar150) & uVar32;
        auVar124._8_4_ = (uint)(fVar130 * fVar176 - fVar92 * fVar153) & uVar35;
        auVar124._12_4_ = (uint)(fVar131 * fVar178 - fVar95 * fVar156) & uVar38;
        auVar198._0_4_ = ~uVar29 & (uint)(local_1708 * fVar144 - fVar122 * local_16f8);
        auVar198._4_4_ = ~uVar32 & (uint)(fStack_1704 * fVar150 - fVar129 * fStack_16f4);
        auVar198._8_4_ = ~uVar35 & (uint)(fStack_1700 * fVar153 - fVar130 * fStack_16f0);
        auVar198._12_4_ = ~uVar38 & (uint)(fStack_16fc * fVar156 - fVar131 * fStack_16ec);
        _local_1858 = auVar198 | auVar124;
        local_1848 = (float)(~uVar30 & (uint)(local_16f8 * local_1718 - fVar83 * fVar144) |
                            (uint)(fVar159 * fVar144 - local_1718 * fVar171) & uVar30);
        fStack_1844 = (float)(~uVar33 & (uint)(fStack_16f4 * fStack_1714 - fVar89 * fVar150) |
                             (uint)(fVar164 * fVar150 - fStack_1714 * fVar174) & uVar33);
        fStack_1840 = (float)(~uVar36 & (uint)(fStack_16f0 * fStack_1710 - fVar91 * fVar153) |
                             (uint)(fVar167 * fVar153 - fStack_1710 * fVar176) & uVar36);
        fStack_183c = (float)(~uVar39 & (uint)(fStack_16ec * fStack_170c - fVar94 * fVar156) |
                             (uint)(fVar169 * fVar156 - fStack_170c * fVar178) & uVar39);
        local_1838 = (float)(~uVar31 & (uint)(fVar83 * fVar122 - local_1718 * local_1708) |
                            (uint)(local_1718 * fVar84 - fVar159 * fVar122) & uVar31);
        fStack_1834 = (float)(~uVar34 & (uint)(fVar89 * fVar129 - fStack_1714 * fStack_1704) |
                             (uint)(fStack_1714 * fVar90 - fVar164 * fVar129) & uVar34);
        fStack_1830 = (float)(~uVar37 & (uint)(fVar91 * fVar130 - fStack_1710 * fStack_1700) |
                             (uint)(fStack_1710 * fVar92 - fVar167 * fVar130) & uVar37);
        fStack_182c = (float)(~uVar40 & (uint)(fVar94 * fVar131 - fStack_170c * fStack_16fc) |
                             (uint)(fStack_170c * fVar95 - fVar169 * fVar131) & uVar40);
        fVar192 = fVar67 * local_1858._0_4_ + fVar96 * local_1848 + local_19c8 * local_1838;
        fVar193 = fVar68 * local_1858._4_4_ + fVar57 * fStack_1844 + fStack_19c4 * fStack_1834;
        fVar194 = fVar78 * local_1858._8_4_ + fVar65 * fStack_1840 + fStack_19c0 * fStack_1830;
        fVar195 = fVar79 * local_1858._12_4_ + fVar66 * fStack_183c + fVar93 * fStack_182c;
        auVar100._0_4_ = fVar192 + fVar192;
        auVar100._4_4_ = fVar193 + fVar193;
        auVar100._8_4_ = fVar194 + fVar194;
        auVar100._12_4_ = fVar195 + fVar195;
        auVar74._0_4_ = fVar158 * local_1838;
        auVar74._4_4_ = fVar163 * fStack_1834;
        auVar74._8_4_ = fVar166 * fStack_1830;
        auVar74._12_4_ = fVar119 * fStack_182c;
        fVar194 = fVar98 * local_1858._0_4_ + fVar110 * local_1848 + auVar74._0_4_;
        fVar195 = fVar105 * local_1858._4_4_ + fVar118 * fStack_1844 + auVar74._4_4_;
        fVar93 = fVar107 * local_1858._8_4_ + fVar120 * fStack_1840 + auVar74._8_4_;
        fVar96 = fVar109 * local_1858._12_4_ + fVar117 * fStack_183c + auVar74._12_4_;
        auVar145 = rcpps(auVar74,auVar100);
        fVar109 = auVar145._0_4_;
        fVar119 = auVar145._4_4_;
        fVar192 = auVar145._8_4_;
        fVar193 = auVar145._12_4_;
        fVar117 = ((1.0 - auVar100._0_4_ * fVar109) * fVar109 + fVar109) * (fVar194 + fVar194);
        fVar119 = ((1.0 - auVar100._4_4_ * fVar119) * fVar119 + fVar119) * (fVar195 + fVar195);
        fVar192 = ((1.0 - auVar100._8_4_ * fVar192) * fVar192 + fVar192) * (fVar93 + fVar93);
        fVar193 = ((1.0 - auVar100._12_4_ * fVar193) * fVar193 + fVar193) * (fVar96 + fVar96);
        fVar109 = *(float *)(ray + 0x80);
        auVar145 = *(undefined1 (*) [16])(ray + 0x80);
        auVar75._4_4_ = -(uint)(*(float *)(ray + 0x34) <= fVar119);
        auVar75._0_4_ = -(uint)(*(float *)(ray + 0x30) <= fVar117);
        auVar75._8_4_ = -(uint)(*(float *)(ray + 0x38) <= fVar192);
        auVar75._12_4_ = -(uint)(*(float *)(ray + 0x3c) <= fVar193);
        auVar101._0_4_ =
             (int)((uint)(auVar100._0_4_ != 0.0 &&
                         (fVar117 <= fVar109 && *(float *)(ray + 0x30) <= fVar117)) * -0x80000000)
             >> 0x1f;
        auVar101._4_4_ =
             (int)((uint)(auVar100._4_4_ != 0.0 &&
                         (fVar119 <= *(float *)(ray + 0x84) && *(float *)(ray + 0x34) <= fVar119)) *
                  -0x80000000) >> 0x1f;
        auVar101._8_4_ =
             (int)((uint)(auVar100._8_4_ != 0.0 &&
                         (fVar192 <= *(float *)(ray + 0x88) && *(float *)(ray + 0x38) <= fVar192)) *
                  -0x80000000) >> 0x1f;
        auVar101._12_4_ =
             (int)((uint)(auVar100._12_4_ != 0.0 &&
                         (fVar193 <= *(float *)(ray + 0x8c) && *(float *)(ray + 0x3c) <= fVar193)) *
                  -0x80000000) >> 0x1f;
        iVar18 = movmskps(iVar18,auVar101 & auVar46);
        if (iVar18 != 0) {
          pRVar3 = (context->scene->geometries).items;
          pGVar4 = pRVar3[uVar14].ptr;
          uVar29 = pGVar4->mask;
          auVar47._0_4_ = -(uint)((uVar29 & *(uint *)(ray + 0x90)) == 0);
          auVar47._4_4_ = -(uint)((uVar29 & *(uint *)(ray + 0x94)) == 0);
          auVar47._8_4_ = -(uint)((uVar29 & *(uint *)(ray + 0x98)) == 0);
          auVar47._12_4_ = -(uint)((uVar29 & *(uint *)(ray + 0x9c)) == 0);
          local_1938 = ~auVar47 & auVar101 & auVar46;
          iVar18 = movmskps((int)pRVar3,local_1938);
          if (iVar18 != 0) {
            local_1808 = *(undefined4 *)((long)&local_1868 + uVar19 * 4);
            if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
               (pGVar4->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
              auVar10._4_4_ = fVar185;
              auVar10._0_4_ = fVar180;
              auVar10._8_4_ = fVar187;
              auVar10._12_4_ = fVar189;
              auVar160 = rcpps(auVar75,auVar10);
              fVar194 = auVar160._0_4_;
              fVar195 = auVar160._4_4_;
              fVar93 = auVar160._8_4_;
              fVar96 = auVar160._12_4_;
              fVar65 = (float)DAT_01feca10;
              fVar66 = DAT_01feca10._4_4_;
              fVar67 = DAT_01feca10._12_4_;
              fVar57 = DAT_01feca10._8_4_;
              fVar41 = (float)(-(uint)(1e-18 <= fVar41) &
                              (uint)((fVar65 - fVar180 * fVar194) * fVar194 + fVar194));
              fVar54 = (float)(-(uint)(1e-18 <= fVar54) &
                              (uint)((fVar66 - fVar185 * fVar195) * fVar195 + fVar195));
              fVar55 = (float)(-(uint)(1e-18 <= fVar55) &
                              (uint)((fVar57 - fVar187 * fVar93) * fVar93 + fVar93));
              fVar56 = (float)(-(uint)(1e-18 <= fVar56) &
                              (uint)((fVar67 - fVar189 * fVar96) * fVar96 + fVar96));
              auVar125._0_4_ = fVar133 * fVar41;
              auVar125._4_4_ = fVar138 * fVar54;
              auVar125._8_4_ = fStack_1910 * fVar55;
              auVar125._12_4_ = fStack_190c * fVar56;
              auVar160 = minps(auVar125,_DAT_01feca10);
              auVar147._0_4_ = (float)local_18f8._0_4_ * fVar41;
              auVar147._4_4_ = (float)local_18f8._4_4_ * fVar54;
              auVar147._8_4_ = fStack_18f0 * fVar55;
              auVar147._12_4_ = fStack_18ec * fVar56;
              auVar172 = minps(auVar147,_DAT_01feca10);
              auVar76._0_4_ = (uint)(fVar65 - auVar160._0_4_) & local_1798._0_4_;
              auVar76._4_4_ = (uint)(fVar66 - auVar160._4_4_) & local_1798._4_4_;
              auVar76._8_4_ = (uint)(fVar57 - auVar160._8_4_) & local_1798._8_4_;
              auVar76._12_4_ = (uint)(fVar67 - auVar160._12_4_) & local_1798._12_4_;
              auVar126._0_4_ = (uint)auVar160._0_4_ & local_17a8._0_4_;
              auVar126._4_4_ = (uint)auVar160._4_4_ & local_17a8._4_4_;
              auVar126._8_4_ = (uint)auVar160._8_4_ & local_17a8._8_4_;
              auVar126._12_4_ = (uint)auVar160._12_4_ & local_17a8._12_4_;
              local_1828 = auVar126 | auVar76;
              local_1818 = (uint)auVar172._0_4_ & local_17a8._0_4_ |
                           (uint)(fVar65 - auVar172._0_4_) & local_1798._0_4_;
              uStack_1814 = (uint)auVar172._4_4_ & local_17a8._4_4_ |
                            (uint)(fVar66 - auVar172._4_4_) & local_1798._4_4_;
              uStack_1810 = (uint)auVar172._8_4_ & local_17a8._8_4_ |
                            (uint)(fVar57 - auVar172._8_4_) & local_1798._8_4_;
              uStack_180c = (uint)auVar172._12_4_ & local_17a8._12_4_ |
                            (uint)(fVar67 - auVar172._12_4_) & local_1798._12_4_;
              uStack_1804 = local_1808;
              uStack_1800 = local_1808;
              uStack_17fc = local_1808;
              uStack_17f4 = local_17f8;
              uStack_17f0 = local_17f8;
              uStack_17ec = local_17f8;
              local_17e8 = context->user->instID[0];
              uStack_17e4 = local_17e8;
              uStack_17e0 = local_17e8;
              uStack_17dc = local_17e8;
              local_17d8 = context->user->instPrimID[0];
              uStack_17d4 = local_17d8;
              uStack_17d0 = local_17d8;
              uStack_17cc = local_17d8;
              auVar62._0_4_ = (uint)fVar117 & local_1938._0_4_;
              auVar62._4_4_ = (uint)fVar119 & local_1938._4_4_;
              auVar62._8_4_ = (uint)fVar192 & local_1938._8_4_;
              auVar62._12_4_ = (uint)fVar193 & local_1938._12_4_;
              auVar77._0_4_ = ~local_1938._0_4_ & (uint)fVar109;
              auVar77._4_4_ = ~local_1938._4_4_ & (uint)*(float *)(ray + 0x84);
              auVar77._8_4_ = ~local_1938._8_4_ & (uint)*(float *)(ray + 0x88);
              auVar77._12_4_ = ~local_1938._12_4_ & (uint)*(float *)(ray + 0x8c);
              *(undefined1 (*) [16])(ray + 0x80) = auVar77 | auVar62;
              args.valid = (int *)local_1938;
              args.geometryUserPtr = pGVar4->userPtr;
              args.context = context->user;
              args.hit = (RTCHitN *)local_1858;
              args.N = 4;
              p_Var16 = pGVar4->occlusionFilterN;
              if (p_Var16 != (RTCFilterFunctionN)0x0) {
                p_Var16 = (RTCFilterFunctionN)(*p_Var16)(&args);
              }
              auVar49._0_4_ = -(uint)(local_1938._0_4_ == 0);
              auVar49._4_4_ = -(uint)(local_1938._4_4_ == 0);
              auVar49._8_4_ = -(uint)(local_1938._8_4_ == 0);
              auVar49._12_4_ = -(uint)(local_1938._12_4_ == 0);
              uVar29 = movmskps((int)p_Var16,auVar49);
              pRVar15 = (RTCRayN *)(ulong)(uVar29 ^ 0xf);
              if ((uVar29 ^ 0xf) == 0) {
                auVar49 = auVar49 ^ _DAT_01febe20;
              }
              else {
                p_Var16 = context->args->filter;
                if ((p_Var16 != (RTCFilterFunctionN)0x0) &&
                   (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                     RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar4->field_8).field_0x2 & 0x40) != 0))))
                {
                  (*p_Var16)(&args);
                }
                auVar63._0_4_ = -(uint)(local_1938._0_4_ == 0);
                auVar63._4_4_ = -(uint)(local_1938._4_4_ == 0);
                auVar63._8_4_ = -(uint)(local_1938._8_4_ == 0);
                auVar63._12_4_ = -(uint)(local_1938._12_4_ == 0);
                auVar49 = auVar63 ^ _DAT_01febe20;
                *(undefined1 (*) [16])(args.ray + 0x80) =
                     ~auVar63 & _DAT_01feba00 | *(undefined1 (*) [16])(args.ray + 0x80) & auVar63;
                pRVar15 = args.ray;
              }
              local_17f8 = (uint)pRVar15;
              local_1938._0_4_ = (auVar49._0_4_ << 0x1f) >> 0x1f;
              local_1938._4_4_ = (auVar49._4_4_ << 0x1f) >> 0x1f;
              local_1938._8_4_ = (auVar49._8_4_ << 0x1f) >> 0x1f;
              local_1938._12_4_ = (auVar49._12_4_ << 0x1f) >> 0x1f;
              *(undefined1 (*) [16])(ray + 0x80) =
                   *(undefined1 (*) [16])(ray + 0x80) & local_1938 | ~local_1938 & auVar145;
            }
            auVar85 = ~local_1938 & auVar85;
          }
        }
      }
      iVar18 = movmskps(local_17f8,auVar85);
      if (iVar18 == 0) {
        uVar29 = 0;
      }
      else {
        fVar109 = *(float *)ray;
        fVar117 = *(float *)(ray + 4);
        fVar119 = *(float *)(ray + 8);
        fVar41 = *(float *)(ray + 0xc);
        fVar54 = *(float *)(ray + 0x10);
        fVar55 = *(float *)(ray + 0x14);
        fVar56 = *(float *)(ray + 0x18);
        fVar180 = *(float *)(ray + 0x1c);
        fVar185 = *(float *)(ray + 0x20);
        fVar187 = *(float *)(ray + 0x24);
        fVar189 = *(float *)(ray + 0x28);
        fVar192 = *(float *)(ray + 0x2c);
        uVar9 = *(undefined8 *)(ray + 0x50);
        auVar145 = *(undefined1 (*) [16])(ray + 0x50);
        fVar143 = fVar121 - fVar109;
        fVar144 = fVar121 - fVar117;
        fVar149 = fVar121 - fVar119;
        fVar121 = fVar121 - fVar41;
        fVar131 = fVar141 - fVar54;
        fVar133 = fVar141 - fVar55;
        fVar138 = fVar141 - fVar56;
        fVar141 = fVar141 - fVar180;
        fVar156 = fVar190 - fVar185;
        fVar158 = fVar190 - fVar187;
        fVar159 = fVar190 - fVar189;
        fVar190 = fVar190 - fVar192;
        fVar163 = local_1768 - fVar109;
        fVar164 = fStack_1764 - fVar117;
        fVar166 = fStack_1760 - fVar119;
        fVar167 = fStack_175c - fVar41;
        fVar169 = local_1758 - fVar54;
        fVar174 = fStack_1754 - fVar55;
        fVar178 = fStack_1750 - fVar56;
        fVar197 = fStack_174c - fVar180;
        fVar57 = (float)local_1908._0_4_ - fVar185;
        fVar65 = (float)local_1908._4_4_ - fVar187;
        fVar66 = fStack_1900 - fVar189;
        fVar67 = fStack_18fc - fVar192;
        fVar109 = local_1728 - fVar109;
        fVar117 = fStack_1724 - fVar117;
        fVar119 = fStack_1720 - fVar119;
        fVar41 = fStack_171c - fVar41;
        fVar54 = local_1748 - fVar54;
        fVar55 = fStack_1744 - fVar55;
        fVar56 = fStack_1740 - fVar56;
        fVar180 = fStack_173c - fVar180;
        fVar185 = local_1738 - fVar185;
        fVar187 = fStack_1734 - fVar187;
        fVar189 = fStack_1730 - fVar189;
        fVar192 = fStack_172c - fVar192;
        local_18f8._0_4_ = fVar109 - fVar143;
        local_18f8._4_4_ = fVar117 - fVar144;
        fStack_18f0 = fVar119 - fVar149;
        fStack_18ec = fVar41 - fVar121;
        fVar150 = fVar54 - fVar131;
        fVar152 = fVar55 - fVar133;
        fVar153 = fVar56 - fVar138;
        fVar155 = fVar180 - fVar141;
        fVar92 = fVar185 - fVar156;
        fVar95 = fVar187 - fVar158;
        fVar105 = fVar189 - fVar159;
        fVar110 = fVar192 - fVar190;
        auVar11 = *(undefined1 (*) [12])(ray + 0x60);
        fVar193 = *(float *)(ray + 0x6c);
        fVar194 = fVar143 - fVar163;
        fVar195 = fVar144 - fVar164;
        fVar93 = fVar149 - fVar166;
        fVar96 = fVar121 - fVar167;
        local_1918._0_4_ = (undefined4)uVar9;
        local_1918._4_4_ = (undefined4)((ulong)uVar9 >> 0x20);
        fStack_1910 = (float)*(undefined8 *)(ray + 0x58);
        fStack_190c = (float)((ulong)*(undefined8 *)(ray + 0x58) >> 0x20);
        fVar120 = fVar131 - fVar169;
        fVar122 = fVar133 - fVar174;
        fVar129 = fVar138 - fVar178;
        fVar130 = fVar141 - fVar197;
        local_19a8 = (float)*(undefined8 *)(ray + 0x40);
        fStack_19a4 = (float)((ulong)*(undefined8 *)(ray + 0x40) >> 0x20);
        fStack_19a0 = (float)*(undefined8 *)(ray + 0x48);
        fStack_199c = (float)((ulong)*(undefined8 *)(ray + 0x48) >> 0x20);
        fVar201 = (fVar150 * (fVar185 + fVar156) - (fVar54 + fVar131) * fVar92) * local_19a8 +
                  ((fVar109 + fVar143) * fVar92 - (fVar185 + fVar156) * (float)local_18f8._0_4_) *
                  (float)local_1918._0_4_ +
                  ((float)local_18f8._0_4_ * (fVar54 + fVar131) - (fVar109 + fVar143) * fVar150) *
                  *(float *)(ray + 0x60);
        fVar202 = (fVar152 * (fVar187 + fVar158) - (fVar55 + fVar133) * fVar95) * fStack_19a4 +
                  ((fVar117 + fVar144) * fVar95 - (fVar187 + fVar158) * (float)local_18f8._4_4_) *
                  (float)local_1918._4_4_ +
                  ((float)local_18f8._4_4_ * (fVar55 + fVar133) - (fVar117 + fVar144) * fVar152) *
                  *(float *)(ray + 100);
        local_1908 = (undefined1  [8])CONCAT44(fVar202,fVar201);
        fStack_1900 = (fVar153 * (fVar189 + fVar159) - (fVar56 + fVar138) * fVar105) * fStack_19a0 +
                      ((fVar119 + fVar149) * fVar105 - (fVar189 + fVar159) * fStack_18f0) *
                      fStack_1910 +
                      (fStack_18f0 * (fVar56 + fVar138) - (fVar119 + fVar149) * fVar153) *
                      *(float *)(ray + 0x68);
        fStack_18fc = (fVar155 * (fVar192 + fVar190) - (fVar180 + fVar141) * fVar110) * fStack_199c
                      + ((fVar41 + fVar121) * fVar110 - (fVar192 + fVar190) * fStack_18ec) *
                        fStack_190c +
                        (fStack_18ec * (fVar180 + fVar141) - (fVar41 + fVar121) * fVar155) * fVar193
        ;
        fVar68 = fVar156 - fVar57;
        fVar78 = fVar158 - fVar65;
        fVar79 = fVar159 - fVar66;
        fVar83 = fVar190 - fVar67;
        local_19c8 = auVar11._0_4_;
        fStack_19c4 = auVar11._4_4_;
        fStack_19c0 = auVar11._8_4_;
        auVar182._0_4_ =
             (fVar120 * (fVar156 + fVar57) - (fVar131 + fVar169) * fVar68) * local_19a8 +
             ((fVar143 + fVar163) * fVar68 - (fVar156 + fVar57) * fVar194) * (float)local_1918._0_4_
             + (fVar194 * (fVar131 + fVar169) - (fVar143 + fVar163) * fVar120) * local_19c8;
        auVar182._4_4_ =
             (fVar122 * (fVar158 + fVar65) - (fVar133 + fVar174) * fVar78) * fStack_19a4 +
             ((fVar144 + fVar164) * fVar78 - (fVar158 + fVar65) * fVar195) * (float)local_1918._4_4_
             + (fVar195 * (fVar133 + fVar174) - (fVar144 + fVar164) * fVar122) * fStack_19c4;
        auVar182._8_4_ =
             (fVar129 * (fVar159 + fVar66) - (fVar138 + fVar178) * fVar79) * fStack_19a0 +
             ((fVar149 + fVar166) * fVar79 - (fVar159 + fVar66) * fVar93) * fStack_1910 +
             (fVar93 * (fVar138 + fVar178) - (fVar149 + fVar166) * fVar129) * fStack_19c0;
        auVar182._12_4_ =
             (fVar130 * (fVar190 + fVar67) - (fVar141 + fVar197) * fVar83) * fStack_199c +
             ((fVar121 + fVar167) * fVar83 - (fVar190 + fVar67) * fVar96) * fStack_190c +
             (fVar96 * (fVar141 + fVar197) - (fVar121 + fVar167) * fVar130) * fVar193;
        fVar84 = fVar163 - fVar109;
        fVar89 = fVar164 - fVar117;
        fVar90 = fVar166 - fVar119;
        fVar91 = fVar167 - fVar41;
        fVar94 = fVar169 - fVar54;
        fVar98 = fVar174 - fVar55;
        fVar107 = fVar178 - fVar56;
        fVar118 = fVar197 - fVar180;
        fVar171 = fVar57 - fVar185;
        fVar176 = fVar65 - fVar187;
        fVar196 = fVar66 - fVar189;
        fVar200 = fVar67 - fVar192;
        auVar136._0_4_ =
             (fVar94 * (fVar185 + fVar57) - (fVar54 + fVar169) * fVar171) * local_19a8 +
             ((fVar109 + fVar163) * fVar171 - (fVar185 + fVar57) * fVar84) * (float)local_1918._0_4_
             + (fVar84 * (fVar54 + fVar169) - (fVar109 + fVar163) * fVar94) * local_19c8;
        auVar136._4_4_ =
             (fVar98 * (fVar187 + fVar65) - (fVar55 + fVar174) * fVar176) * fStack_19a4 +
             ((fVar117 + fVar164) * fVar176 - (fVar187 + fVar65) * fVar89) * (float)local_1918._4_4_
             + (fVar89 * (fVar55 + fVar174) - (fVar117 + fVar164) * fVar98) * fStack_19c4;
        auVar136._8_4_ =
             (fVar107 * (fVar189 + fVar66) - (fVar56 + fVar178) * fVar196) * fStack_19a0 +
             ((fVar119 + fVar166) * fVar196 - (fVar189 + fVar66) * fVar90) * fStack_1910 +
             (fVar90 * (fVar56 + fVar178) - (fVar119 + fVar166) * fVar107) * fStack_19c0;
        auVar136._12_4_ =
             (fVar118 * (fVar192 + fVar67) - (fVar180 + fVar197) * fVar200) * fStack_199c +
             ((fVar41 + fVar167) * fVar200 - (fVar192 + fVar67) * fVar91) * fStack_190c +
             (fVar91 * (fVar180 + fVar197) - (fVar41 + fVar167) * fVar118) * fVar193;
        auVar116._0_4_ = fVar201 + auVar182._0_4_ + auVar136._0_4_;
        auVar116._4_4_ = fVar202 + auVar182._4_4_ + auVar136._4_4_;
        auVar116._8_4_ = fStack_1900 + auVar182._8_4_ + auVar136._8_4_;
        auVar116._12_4_ = fStack_18fc + auVar182._12_4_ + auVar136._12_4_;
        auVar161._8_4_ = fStack_1900;
        auVar161._0_8_ = local_1908;
        auVar161._12_4_ = fStack_18fc;
        auVar160 = minps(auVar161,auVar182);
        auVar160 = minps(auVar160,auVar136);
        auVar172 = maxps(_local_1908,auVar182);
        auVar172 = maxps(auVar172,auVar136);
        uVar29 = (uint)DAT_01fec6c0;
        uVar30 = DAT_01fec6c0._4_4_;
        uVar31 = DAT_01fec6c0._8_4_;
        uVar32 = DAT_01fec6c0._12_4_;
        fVar109 = (float)((uint)auVar116._0_4_ & uVar29) * 1.1920929e-07;
        fVar117 = (float)((uint)auVar116._4_4_ & uVar30) * 1.1920929e-07;
        fVar119 = (float)((uint)auVar116._8_4_ & uVar31) * 1.1920929e-07;
        fVar41 = (float)((uint)auVar116._12_4_ & uVar32) * 1.1920929e-07;
        local_1a48 = auVar85._0_4_;
        uStack_1a44 = auVar85._4_4_;
        uStack_1a40 = auVar85._8_4_;
        uStack_1a3c = auVar85._12_4_;
        auVar199._0_4_ =
             -(uint)(auVar172._0_4_ <= fVar109 || -fVar109 <= auVar160._0_4_) & local_1a48;
        auVar199._4_4_ =
             -(uint)(auVar172._4_4_ <= fVar117 || -fVar117 <= auVar160._4_4_) & uStack_1a44;
        auVar199._8_4_ =
             -(uint)(auVar172._8_4_ <= fVar119 || -fVar119 <= auVar160._8_4_) & uStack_1a40;
        auVar199._12_4_ =
             -(uint)(auVar172._12_4_ <= fVar41 || -fVar41 <= auVar160._12_4_) & uStack_1a3c;
        local_17f8 = movmskps(iVar18,auVar199);
        if (local_17f8 != 0) {
          uVar33 = -(uint)((float)((uint)(fVar94 * fVar68) & uVar29) <=
                          (float)((uint)(fVar120 * fVar92) & uVar29));
          uVar36 = -(uint)((float)((uint)(fVar98 * fVar78) & uVar30) <=
                          (float)((uint)(fVar122 * fVar95) & uVar30));
          uVar39 = -(uint)((float)((uint)(fVar107 * fVar79) & uVar31) <=
                          (float)((uint)(fVar129 * fVar105) & uVar31));
          uVar104 = -(uint)((float)((uint)(fVar118 * fVar83) & uVar32) <=
                           (float)((uint)(fVar130 * fVar110) & uVar32));
          uVar34 = -(uint)((float)((uint)(fVar194 * fVar171) & uVar29) <=
                          (float)((uint)((float)local_18f8._0_4_ * fVar68) & uVar29));
          uVar37 = -(uint)((float)((uint)(fVar195 * fVar176) & uVar30) <=
                          (float)((uint)((float)local_18f8._4_4_ * fVar78) & uVar30));
          uVar40 = -(uint)((float)((uint)(fVar93 * fVar196) & uVar31) <=
                          (float)((uint)(fStack_18f0 * fVar79) & uVar31));
          uVar106 = -(uint)((float)((uint)(fVar96 * fVar200) & uVar32) <=
                           (float)((uint)(fStack_18ec * fVar83) & uVar32));
          uVar35 = -(uint)((float)((uint)(fVar84 * fVar120) & uVar29) <=
                          (float)((uint)(fVar194 * fVar150) & uVar29));
          uVar38 = -(uint)((float)((uint)(fVar89 * fVar122) & uVar30) <=
                          (float)((uint)(fVar195 * fVar152) & uVar30));
          uVar97 = -(uint)((float)((uint)(fVar90 * fVar129) & uVar31) <=
                          (float)((uint)(fVar93 * fVar153) & uVar31));
          uVar108 = -(uint)((float)((uint)(fVar91 * fVar130) & uVar32) <=
                           (float)((uint)(fVar96 * fVar155) & uVar32));
          local_1858._0_4_ =
               ~uVar33 & (uint)(fVar150 * fVar68 - fVar120 * fVar92) |
               (uint)(fVar120 * fVar171 - fVar94 * fVar68) & uVar33;
          local_1858._4_4_ =
               ~uVar36 & (uint)(fVar152 * fVar78 - fVar122 * fVar95) |
               (uint)(fVar122 * fVar176 - fVar98 * fVar78) & uVar36;
          fStack_1850 = (float)(~uVar39 & (uint)(fVar153 * fVar79 - fVar129 * fVar105) |
                               (uint)(fVar129 * fVar196 - fVar107 * fVar79) & uVar39);
          fStack_184c = (float)(~uVar104 & (uint)(fVar155 * fVar83 - fVar130 * fVar110) |
                               (uint)(fVar130 * fVar200 - fVar118 * fVar83) & uVar104);
          local_1848 = (float)(~uVar34 & (uint)(fVar92 * fVar194 - (float)local_18f8._0_4_ * fVar68)
                              | (uint)(fVar84 * fVar68 - fVar194 * fVar171) & uVar34);
          fStack_1844 = (float)(~uVar37 & (uint)(fVar95 * fVar195 - (float)local_18f8._4_4_ * fVar78
                                                ) |
                               (uint)(fVar89 * fVar78 - fVar195 * fVar176) & uVar37);
          fStack_1840 = (float)(~uVar40 & (uint)(fVar105 * fVar93 - fStack_18f0 * fVar79) |
                               (uint)(fVar90 * fVar79 - fVar93 * fVar196) & uVar40);
          fStack_183c = (float)(~uVar106 & (uint)(fVar110 * fVar96 - fStack_18ec * fVar83) |
                               (uint)(fVar91 * fVar83 - fVar96 * fVar200) & uVar106);
          local_1838 = (float)(~uVar35 & (uint)((float)local_18f8._0_4_ * fVar120 -
                                               fVar194 * fVar150) |
                              (uint)(fVar194 * fVar94 - fVar84 * fVar120) & uVar35);
          fStack_1834 = (float)(~uVar38 & (uint)((float)local_18f8._4_4_ * fVar122 -
                                                fVar195 * fVar152) |
                               (uint)(fVar195 * fVar98 - fVar89 * fVar122) & uVar38);
          fStack_1830 = (float)(~uVar97 & (uint)(fStack_18f0 * fVar129 - fVar93 * fVar153) |
                               (uint)(fVar93 * fVar107 - fVar90 * fVar129) & uVar97);
          fStack_182c = (float)(~uVar108 & (uint)(fStack_18ec * fVar130 - fVar96 * fVar155) |
                               (uint)(fVar96 * fVar118 - fVar91 * fVar130) & uVar108);
          fVar109 = local_19a8 * (float)local_1858._0_4_ +
                    (float)local_1918._0_4_ * local_1848 + local_19c8 * local_1838;
          fVar117 = fStack_19a4 * (float)local_1858._4_4_ +
                    (float)local_1918._4_4_ * fStack_1844 + fStack_19c4 * fStack_1834;
          fVar119 = fStack_19a0 * fStack_1850 +
                    fStack_1910 * fStack_1840 + fStack_19c0 * fStack_1830;
          fVar41 = fStack_199c * fStack_184c + fStack_190c * fStack_183c + fVar193 * fStack_182c;
          auVar102._0_4_ = fVar109 + fVar109;
          auVar102._4_4_ = fVar117 + fVar117;
          auVar102._8_4_ = fVar119 + fVar119;
          auVar102._12_4_ = fVar41 + fVar41;
          auVar48._0_4_ = fVar156 * local_1838;
          auVar48._4_4_ = fVar158 * fStack_1834;
          auVar48._8_4_ = fVar159 * fStack_1830;
          auVar48._12_4_ = fVar190 * fStack_182c;
          fVar190 = fVar143 * (float)local_1858._0_4_ + fVar131 * local_1848 + auVar48._0_4_;
          fVar41 = fVar144 * (float)local_1858._4_4_ + fVar133 * fStack_1844 + auVar48._4_4_;
          fVar54 = fVar149 * fStack_1850 + fVar138 * fStack_1840 + auVar48._8_4_;
          fVar141 = fVar121 * fStack_184c + fVar141 * fStack_183c + auVar48._12_4_;
          auVar160 = rcpps(auVar48,auVar102);
          fVar109 = auVar160._0_4_;
          fVar117 = auVar160._4_4_;
          fVar119 = auVar160._8_4_;
          fVar121 = auVar160._12_4_;
          fVar109 = ((1.0 - auVar102._0_4_ * fVar109) * fVar109 + fVar109) * (fVar190 + fVar190);
          fVar117 = ((1.0 - auVar102._4_4_ * fVar117) * fVar117 + fVar117) * (fVar41 + fVar41);
          fVar119 = ((1.0 - auVar102._8_4_ * fVar119) * fVar119 + fVar119) * (fVar54 + fVar54);
          fVar121 = ((1.0 - auVar102._12_4_ * fVar121) * fVar121 + fVar121) * (fVar141 + fVar141);
          auVar160 = *(undefined1 (*) [16])(ray + 0x80);
          auVar103._0_4_ =
               (int)((uint)(auVar102._0_4_ != 0.0 &&
                           (fVar109 <= auVar160._0_4_ && *(float *)(ray + 0x30) <= fVar109)) *
                    -0x80000000) >> 0x1f;
          auVar103._4_4_ =
               (int)((uint)(auVar102._4_4_ != 0.0 &&
                           (fVar117 <= auVar160._4_4_ && *(float *)(ray + 0x34) <= fVar117)) *
                    -0x80000000) >> 0x1f;
          auVar103._8_4_ =
               (int)((uint)(auVar102._8_4_ != 0.0 &&
                           (fVar119 <= auVar160._8_4_ && *(float *)(ray + 0x38) <= fVar119)) *
                    -0x80000000) >> 0x1f;
          auVar103._12_4_ =
               (int)((uint)(auVar102._12_4_ != 0.0 &&
                           (fVar121 <= auVar160._12_4_ && *(float *)(ray + 0x3c) <= fVar121)) *
                    -0x80000000) >> 0x1f;
          local_17f8 = movmskps(local_17f8,auVar103 & auVar199);
          if (local_17f8 != 0) {
            local_17f8 = *(uint *)(lVar23 + uVar19 * 4);
            pRVar3 = (context->scene->geometries).items;
            pGVar4 = pRVar3[local_17f8].ptr;
            uVar33 = pGVar4->mask;
            auVar81._0_4_ = -(uint)((uVar33 & *(uint *)(ray + 0x90)) == 0);
            auVar81._4_4_ = -(uint)((uVar33 & *(uint *)(ray + 0x94)) == 0);
            auVar81._8_4_ = -(uint)((uVar33 & *(uint *)(ray + 0x98)) == 0);
            auVar81._12_4_ = -(uint)((uVar33 & *(uint *)(ray + 0x9c)) == 0);
            local_1938 = ~auVar81 & auVar103 & auVar199;
            iVar18 = movmskps((int)pRVar3,local_1938);
            if (iVar18 != 0) {
              local_1808 = *(undefined4 *)((long)&local_1868 + uVar19 * 4);
              if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                 (pGVar4->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                auVar172 = rcpps(local_1928,auVar116);
                fVar141 = auVar172._0_4_;
                fVar190 = auVar172._4_4_;
                fVar41 = auVar172._8_4_;
                fVar54 = auVar172._12_4_;
                fVar56 = (float)DAT_01feca10;
                fVar180 = DAT_01feca10._4_4_;
                fVar185 = DAT_01feca10._12_4_;
                fVar55 = DAT_01feca10._8_4_;
                fVar141 = (float)(-(uint)(1e-18 <= (float)((uint)auVar116._0_4_ & uVar29)) &
                                 (uint)((fVar56 - auVar116._0_4_ * fVar141) * fVar141 + fVar141));
                fVar190 = (float)(-(uint)(1e-18 <= (float)((uint)auVar116._4_4_ & uVar30)) &
                                 (uint)((fVar180 - auVar116._4_4_ * fVar190) * fVar190 + fVar190));
                fVar41 = (float)(-(uint)(1e-18 <= (float)((uint)auVar116._8_4_ & uVar31)) &
                                (uint)((fVar55 - auVar116._8_4_ * fVar41) * fVar41 + fVar41));
                fVar54 = (float)(-(uint)(1e-18 <= (float)((uint)auVar116._12_4_ & uVar32)) &
                                (uint)((fVar185 - auVar116._12_4_ * fVar54) * fVar54 + fVar54));
                auVar127._0_4_ = fVar201 * fVar141;
                auVar127._4_4_ = fVar202 * fVar190;
                auVar127._8_4_ = fStack_1900 * fVar41;
                auVar127._12_4_ = fStack_18fc * fVar54;
                auVar172 = minps(auVar127,_DAT_01feca10);
                auVar183._0_4_ = auVar182._0_4_ * fVar141;
                auVar183._4_4_ = auVar182._4_4_ * fVar190;
                auVar183._8_4_ = auVar182._8_4_ * fVar41;
                auVar183._12_4_ = auVar182._12_4_ * fVar54;
                auVar181 = minps(auVar183,_DAT_01feca10);
                auVar50._0_4_ = (uint)(fVar56 - auVar172._0_4_) & local_17b8._0_4_;
                auVar50._4_4_ = (uint)(fVar180 - auVar172._4_4_) & local_17b8._4_4_;
                auVar50._8_4_ = (uint)(fVar55 - auVar172._8_4_) & local_17b8._8_4_;
                auVar50._12_4_ = (uint)(fVar185 - auVar172._12_4_) & local_17b8._12_4_;
                auVar128._0_4_ = (uint)auVar172._0_4_ & local_17c8._0_4_;
                auVar128._4_4_ = (uint)auVar172._4_4_ & local_17c8._4_4_;
                auVar128._8_4_ = (uint)auVar172._8_4_ & local_17c8._8_4_;
                auVar128._12_4_ = (uint)auVar172._12_4_ & local_17c8._12_4_;
                local_1828 = auVar128 | auVar50;
                local_1818 = (uint)auVar181._0_4_ & local_17c8._0_4_ |
                             (uint)(fVar56 - auVar181._0_4_) & local_17b8._0_4_;
                uStack_1814 = (uint)auVar181._4_4_ & local_17c8._4_4_ |
                              (uint)(fVar180 - auVar181._4_4_) & local_17b8._4_4_;
                uStack_1810 = (uint)auVar181._8_4_ & local_17c8._8_4_ |
                              (uint)(fVar55 - auVar181._8_4_) & local_17b8._8_4_;
                uStack_180c = (uint)auVar181._12_4_ & local_17c8._12_4_ |
                              (uint)(fVar185 - auVar181._12_4_) & local_17b8._12_4_;
                uStack_1804 = local_1808;
                uStack_1800 = local_1808;
                uStack_17fc = local_1808;
                uStack_17f4 = local_17f8;
                uStack_17f0 = local_17f8;
                uStack_17ec = local_17f8;
                local_17e8 = context->user->instID[0];
                uStack_17e4 = local_17e8;
                uStack_17e0 = local_17e8;
                uStack_17dc = local_17e8;
                local_17d8 = context->user->instPrimID[0];
                uStack_17d4 = local_17d8;
                uStack_17d0 = local_17d8;
                uStack_17cc = local_17d8;
                auVar88._0_4_ = (uint)fVar109 & local_1938._0_4_;
                auVar88._4_4_ = (uint)fVar117 & local_1938._4_4_;
                auVar88._8_4_ = (uint)fVar119 & local_1938._8_4_;
                auVar88._12_4_ = (uint)fVar121 & local_1938._12_4_;
                auVar51._0_4_ = ~local_1938._0_4_ & (uint)auVar160._0_4_;
                auVar51._4_4_ = ~local_1938._4_4_ & (uint)auVar160._4_4_;
                auVar51._8_4_ = ~local_1938._8_4_ & (uint)auVar160._8_4_;
                auVar51._12_4_ = ~local_1938._12_4_ & (uint)auVar160._12_4_;
                *(undefined1 (*) [16])(ray + 0x80) = auVar51 | auVar88;
                args.valid = (int *)local_1938;
                args.geometryUserPtr = pGVar4->userPtr;
                args.context = context->user;
                args.hit = (RTCHitN *)local_1858;
                args.N = 4;
                p_Var16 = pGVar4->occlusionFilterN;
                _local_1918 = auVar145;
                args.ray = (RTCRayN *)ray;
                if (p_Var16 != (RTCFilterFunctionN)0x0) {
                  p_Var16 = (RTCFilterFunctionN)(*p_Var16)(&args);
                }
                auVar82._0_4_ = -(uint)(local_1938._0_4_ == 0);
                auVar82._4_4_ = -(uint)(local_1938._4_4_ == 0);
                auVar82._8_4_ = -(uint)(local_1938._8_4_ == 0);
                auVar82._12_4_ = -(uint)(local_1938._12_4_ == 0);
                uVar29 = movmskps((int)p_Var16,auVar82);
                pRVar15 = (RTCRayN *)(ulong)(uVar29 ^ 0xf);
                if ((uVar29 ^ 0xf) == 0) {
                  auVar82 = auVar82 ^ _DAT_01febe20;
                }
                else {
                  p_Var16 = context->args->filter;
                  if ((p_Var16 != (RTCFilterFunctionN)0x0) &&
                     (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                       RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar4->field_8).field_0x2 & 0x40) != 0))
                     )) {
                    (*p_Var16)(&args);
                  }
                  auVar52._0_4_ = -(uint)(local_1938._0_4_ == 0);
                  auVar52._4_4_ = -(uint)(local_1938._4_4_ == 0);
                  auVar52._8_4_ = -(uint)(local_1938._8_4_ == 0);
                  auVar52._12_4_ = -(uint)(local_1938._12_4_ == 0);
                  auVar82 = auVar52 ^ _DAT_01febe20;
                  *(undefined1 (*) [16])(args.ray + 0x80) =
                       ~auVar52 & _DAT_01feba00 | *(undefined1 (*) [16])(args.ray + 0x80) & auVar52;
                  pRVar15 = args.ray;
                }
                local_17f8 = (uint)pRVar15;
                local_1938._0_4_ = (auVar82._0_4_ << 0x1f) >> 0x1f;
                local_1938._4_4_ = (auVar82._4_4_ << 0x1f) >> 0x1f;
                local_1938._8_4_ = (auVar82._8_4_ << 0x1f) >> 0x1f;
                local_1938._12_4_ = (auVar82._12_4_ << 0x1f) >> 0x1f;
                *(undefined1 (*) [16])(ray + 0x80) =
                     *(undefined1 (*) [16])(ray + 0x80) & local_1938 | ~local_1938 & auVar160;
              }
              auVar85 = ~local_1938 & auVar85;
            }
          }
        }
        iVar18 = movmskps(local_17f8,auVar85);
        uVar29 = CONCAT31((int3)((uint)iVar18 >> 8),iVar18 != 0);
      }
      uVar14 = (ulong)uVar29;
      if (((char)uVar29 == '\0') ||
         (uVar14 = uVar19 + 1, bVar28 = 2 < uVar19, uVar19 = uVar14, bVar28)) break;
    }
    auVar43._0_4_ = local_1928._0_4_ & auVar85._0_4_;
    auVar43._4_4_ = local_1928._4_4_ & auVar85._4_4_;
    auVar43._8_4_ = local_1928._8_4_ & auVar85._8_4_;
    auVar43._12_4_ = local_1928._12_4_ & auVar85._12_4_;
    uVar29 = movmskps((int)uVar14,auVar43);
    if (uVar29 == 0) break;
  }
  uVar19 = CONCAT44(auVar43._4_4_,auVar43._0_4_);
  auVar181._0_8_ = uVar19 ^ 0xffffffffffffffff;
  auVar181._8_4_ = auVar43._8_4_ ^ 0xffffffff;
  auVar181._12_4_ = auVar43._12_4_ ^ 0xffffffff;
LAB_001be900:
  bVar28 = true;
  local_19b8 = local_19b8 | auVar181;
  uVar29 = movmskps(uVar29,local_19b8);
  puVar12 = (undefined1 *)(ulong)uVar29;
  if (uVar29 != 0xf) {
    auVar53._0_8_ = local_19b8._0_8_ & 0xff800000ff800000;
    auVar53._8_4_ = local_19b8._8_4_ & 0xff800000;
    auVar53._12_4_ = local_19b8._12_4_ & 0xff800000;
    auVar64._0_4_ = ~local_19b8._0_4_ & (uint)fVar142;
    auVar64._4_4_ = ~local_19b8._4_4_ & (uint)fVar148;
    auVar64._8_4_ = ~local_19b8._8_4_ & (uint)fVar151;
    auVar64._12_4_ = ~local_19b8._12_4_ & (uint)fVar154;
    auVar146 = auVar64 | auVar53;
    bVar28 = false;
  }
LAB_001be938:
  if (bVar28) {
    *(uint *)(ray + 0x80) =
         ~(auVar111._0_4_ & local_19b8._0_4_) & *(uint *)(ray + 0x80) |
         auVar111._0_4_ & local_19b8._0_4_ & 0xff800000;
    *(uint *)(ray + 0x84) =
         ~(auVar111._4_4_ & local_19b8._4_4_) & *(uint *)(ray + 0x84) |
         auVar111._4_4_ & local_19b8._4_4_ & 0xff800000;
    *(uint *)(ray + 0x88) =
         ~(auVar111._8_4_ & local_19b8._8_4_) & *(uint *)(ray + 0x88) |
         auVar111._8_4_ & local_19b8._8_4_ & 0xff800000;
    *(uint *)(ray + 0x8c) =
         ~(auVar111._12_4_ & local_19b8._12_4_) & *(uint *)(ray + 0x8c) |
         auVar111._12_4_ & local_19b8._12_4_ & 0xff800000;
    return;
  }
  goto LAB_001bd393;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }